

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void DockNodeTreeUpdateSplitterFindTouchingNode
               (ImGuiDockNode *node,ImGuiAxis axis,int side,
               ImVector<ImGuiDockNode_*> *touching_nodes)

{
  ImGuiDockNode *node_00;
  ImGuiDockNode *pIVar1;
  ImGuiDockNode *local_28;
  
  while( true ) {
    pIVar1 = node;
    node_00 = pIVar1->ChildNodes[0];
    if (node_00 == (ImGuiDockNode *)0x0) {
      local_28 = pIVar1;
      ImVector<ImGuiDockNode_*>::push_back(touching_nodes,&local_28);
      return;
    }
    if (((node_00->field_0xbd & 2) != 0) &&
       (((side == 0 || (pIVar1->SplitAxis != axis)) ||
        ((pIVar1->ChildNodes[1]->field_0xbd & 2) == 0)))) {
      DockNodeTreeUpdateSplitterFindTouchingNode(node_00,axis,side,touching_nodes);
    }
    node = pIVar1->ChildNodes[1];
    if ((node->field_0xbd & 2) == 0) break;
    if (((side != 1) && (pIVar1->SplitAxis == axis)) &&
       ((pIVar1->ChildNodes[0]->field_0xbd & 2) != 0)) {
      return;
    }
  }
  return;
}

Assistant:

static void DockNodeTreeUpdateSplitterFindTouchingNode(ImGuiDockNode* node, ImGuiAxis axis, int side, ImVector<ImGuiDockNode*>* touching_nodes)
{
    if (node->IsLeafNode())
    {
        touching_nodes->push_back(node);
        return;
    }
    if (node->ChildNodes[0]->IsVisible)
        if (node->SplitAxis != axis || side == 0 || !node->ChildNodes[1]->IsVisible)
            DockNodeTreeUpdateSplitterFindTouchingNode(node->ChildNodes[0], axis, side, touching_nodes);
    if (node->ChildNodes[1]->IsVisible)
        if (node->SplitAxis != axis || side == 1 || !node->ChildNodes[0]->IsVisible)
            DockNodeTreeUpdateSplitterFindTouchingNode(node->ChildNodes[1], axis, side, touching_nodes);
}